

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Condition.cpp
# Opt level: O3

bool __thiscall Condition::Wait(Condition *this,Mutex *mutex,uint32_t timeoutms)

{
  int iVar1;
  long lVar2;
  long lVar3;
  timeval tv;
  timespec local_30;
  
  if (timeoutms == 0) {
    pthread_cond_wait((pthread_cond_t *)this,(pthread_mutex_t *)mutex);
    return true;
  }
  gettimeofday((timeval *)&local_30,(__timezone_ptr_t)0x0);
  local_30.tv_sec = local_30.tv_sec + (int)timeoutms / 1000;
  local_30.tv_nsec = (long)(((int)timeoutms % 1000) * 1000000) + local_30.tv_nsec * 1000;
  if (local_30.tv_nsec < 1000000000) {
    if (-1 < local_30.tv_nsec) goto LAB_00115f25;
    lVar2 = 1000000000;
    lVar3 = -1;
  }
  else {
    lVar2 = -1000000000;
    lVar3 = 1;
  }
  local_30.tv_sec = lVar3 + local_30.tv_sec;
  local_30.tv_nsec = lVar2 + local_30.tv_nsec;
LAB_00115f25:
  iVar1 = pthread_cond_timedwait((pthread_cond_t *)this,(pthread_mutex_t *)mutex,&local_30);
  if (iVar1 == 0) {
    return true;
  }
  return false;
}

Assistant:

bool Condition::Wait( Mutex &mutex, uint32_t timeoutms )
{
	if ( timeoutms > 0 )
	{
		struct timespec timeout;
		TimeUtils::getCurTime( &timeout );
		TimeUtils::addOffset( &timeout, timeoutms );
		if ( pthread_cond_timedwait( &mCond, &mutex.mMutex, &timeout ) != 0 )
			return false;
	}
	else
		Wait( mutex );
	
	return true;
}